

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O3

UniquePtr<EC_KEY> __thiscall
anon_unknown.dwarf_5c5a51::DecodeECPrivateKey
          (anon_unknown_dwarf_5c5a51 *this,uint8_t *in,size_t in_len)

{
  _Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter> _Var1;
  UniquePtr<EC_KEY> extraout_RAX;
  _Head_base<0UL,_ec_key_st_*,_false> _Var2;
  UniquePtr<EC_KEY> ret;
  CBS cbs;
  __uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter> local_30;
  CBS local_28;
  
  local_28.data = in;
  local_28.len = in_len;
  _Var1.super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
       (_Head_base<0UL,_ec_key_st_*,_false>)EC_KEY_parse_private_key(&local_28,(EC_GROUP *)0x0);
  local_30._M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
       (tuple<ec_key_st_*,_bssl::internal::Deleter>)
       (tuple<ec_key_st_*,_bssl::internal::Deleter>)
       _Var1.super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl;
  if (_Var1.super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl != (ec_key_st *)0x0 &&
      local_28.len == 0) {
    local_30._M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
         (tuple<ec_key_st_*,_bssl::internal::Deleter>)
         (tuple<ec_key_st_*,_bssl::internal::Deleter>)(EC_KEY *)0x0;
  }
  _Var2._M_head_impl = (EC_KEY *)0x0;
  if (_Var1.super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl != (ec_key_st *)0x0 &&
      local_28.len == 0) {
    _Var2._M_head_impl = (ec_key_st *)_Var1.super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl;
  }
  *(ec_key_st **)this = _Var2._M_head_impl;
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_30);
  return (UniquePtr<EC_KEY>)
         extraout_RAX._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl;
}

Assistant:

static bssl::UniquePtr<EC_KEY> DecodeECPrivateKey(const uint8_t *in,
                                                  size_t in_len) {
  CBS cbs;
  CBS_init(&cbs, in, in_len);
  bssl::UniquePtr<EC_KEY> ret(EC_KEY_parse_private_key(&cbs, NULL));
  if (!ret || CBS_len(&cbs) != 0) {
    return nullptr;
  }
  return ret;
}